

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectBase.hpp
# Opt level: O0

void __thiscall
Diligent::ObjectBase<Diligent::IResourceMapping>::QueryInterface
          (ObjectBase<Diligent::IResourceMapping> *this,INTERFACE_ID *IID,IObject **ppInterface)

{
  bool bVar1;
  IObject **ppInterface_local;
  INTERFACE_ID *IID_local;
  ObjectBase<Diligent::IResourceMapping> *this_local;
  
  if (ppInterface != (IObject **)0x0) {
    *ppInterface = (IObject *)0x0;
    bVar1 = INTERFACE_ID::operator==(IID,(INTERFACE_ID *)Diligent::IID_Unknown);
    if (bVar1) {
      *ppInterface = (IObject *)this;
      (*(*ppInterface)->_vptr_IObject[1])();
    }
  }
  return;
}

Assistant:

QueryInterface(const INTERFACE_ID& IID, IObject** ppInterface)
    {
        if (ppInterface == nullptr)
            return;

        *ppInterface = nullptr;
        if (IID == IID_Unknown)
        {
            *ppInterface = this;
            (*ppInterface)->AddRef();
        }
    }